

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::HomeArguments(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ParseNodeFnc *pPVar1;
  Symbol *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ParseNodeVar *pPVar6;
  FunctionBody *pFVar7;
  ParseNodePtr pPVar8;
  RegSlot pos;
  ParseNode *pPVar9;
  ushort uVar10;
  
  bVar4 = ShouldTrackDebuggerMetadata(this);
  if (bVar4) {
    pPVar1 = funcInfo->root;
    pPVar8 = pPVar1->pnodeParams;
    if (pPVar8 != (ParseNodePtr)0x0) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        if ((byte)(pPVar8->nop + ~knopList) < 3) {
          pPVar6 = ParseNode::AsParseNodeVar(pPVar8);
          pSVar2 = pPVar6->sym;
          bVar4 = Symbol::IsInSlot(pSVar2,this,funcInfo,false);
          if (!bVar4) {
            if ((pSVar2->field_0x42 & 0x80) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x987,"(!formal->GetHasInit())","!formal->GetHasInit()");
              if (!bVar4) goto LAB_0080428f;
              *puVar5 = 0;
            }
            pFVar7 = FuncInfo::GetParsedFunctionBody(funcInfo);
            Js::FunctionBody::InsertSymbolToRegSlotList
                      (pFVar7,&pSVar2->name,pSVar2->location,funcInfo->varRegsCount);
          }
        }
        pPVar8 = ParseNode::GetFormalNext(pPVar8);
      } while (pPVar8 != (ParseNodePtr)0x0);
    }
    pPVar9 = pPVar1->pnodeRest;
    if ((pPVar9 != (ParseNode *)0x0) && ((byte)(pPVar9->nop + ~knopList) < 3)) {
      pPVar6 = ParseNode::AsParseNodeVar(pPVar9);
      pSVar2 = pPVar6->sym;
      bVar4 = Symbol::IsInSlot(pSVar2,this,funcInfo,false);
      if (!bVar4) {
        if ((pSVar2->field_0x42 & 0x80) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x987,"(!formal->GetHasInit())","!formal->GetHasInit()");
          if (!bVar4) {
LAB_0080428f:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar5 = 0;
        }
        pFVar7 = FuncInfo::GetParsedFunctionBody(funcInfo);
        Js::FunctionBody::InsertSymbolToRegSlotList
                  (pFVar7,&pSVar2->name,pSVar2->location,funcInfo->varRegsCount);
      }
    }
  }
  pPVar1 = funcInfo->root;
  if ((funcInfo->field_0xb4 & 8) == 0) {
    pPVar8 = pPVar1->pnodeParams;
    if (pPVar8 == (ParseNodePtr)0x0) {
      pos = 1;
    }
    else {
      uVar10 = 1;
      do {
        EmitLoadFormalIntoRegister(this,pPVar8,(uint)uVar10,funcInfo);
        uVar10 = uVar10 + 1;
        pPVar8 = ParseNode::GetFormalNext(pPVar8);
      } while (pPVar8 != (ParseNodePtr)0x0);
      pos = (RegSlot)uVar10;
    }
    pPVar9 = pPVar1->pnodeRest;
    if (pPVar9 == (ParseNodePtr)0x0) {
      return;
    }
  }
  else {
    pPVar9 = pPVar1->pnodeRest;
    if (pPVar9 == (ParseNode *)0x0) {
      return;
    }
    if (2 < (byte)(pPVar9->nop + ~knopList)) {
      return;
    }
    pPVar6 = ParseNode::AsParseNodeVar(pPVar9);
    pos = pPVar6->sym->location + 1;
  }
  EmitLoadFormalIntoRegister(this,pPVar9,pos,funcInfo);
  return;
}

Assistant:

void ByteCodeGenerator::HomeArguments(FuncInfo *funcInfo)
{
    if (ShouldTrackDebuggerMetadata())
    {
        // Add formals to the debugger propertyidcontainer for reg slots
        auto addFormalsToPropertyIdContainer = [this, funcInfo](ParseNode *pnodeFormal)
        {
            if (pnodeFormal->IsVarLetOrConst())
            {
                Symbol* formal = pnodeFormal->AsParseNodeVar()->sym;
                if (!formal->IsInSlot(this, funcInfo))
                {
                    Assert(!formal->GetHasInit());
                    funcInfo->GetParsedFunctionBody()->InsertSymbolToRegSlotList(formal->GetName(), formal->GetLocation(), funcInfo->varRegsCount);
                }
            }
        };

        MapFormals(funcInfo->root, addFormalsToPropertyIdContainer);
    }

    // Transfer formal parameters to their home locations on the local frame.
    if (funcInfo->GetHasArguments())
    {
        ParseNodePtr rest = funcInfo->root->pnodeRest;
        if (rest != nullptr && rest->IsVarLetOrConst())
        {
            // Since we don't have to iterate over arguments here, we'll trust the location to be correct.
            Symbol* sym = rest->AsParseNodeVar()->sym;
            EmitLoadFormalIntoRegister(rest, sym->GetLocation() + 1, funcInfo);
        }

        // The arguments object creation helper does this work for us.
        return;
    }

    Js::ArgSlot pos = 1;
    auto loadFormal = [&](ParseNode *pnodeFormal)
    {
        EmitLoadFormalIntoRegister(pnodeFormal, pos, funcInfo);
        pos++;
    };
    MapFormals(funcInfo->root, loadFormal);
}